

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

numeric * cs_impl::math_cs_ext::root(numeric *__return_storage_ptr__,numeric *a,numeric *b)

{
  unkbyte10 in_ST0;
  
  powl();
  __return_storage_ptr__->type = false;
  *(unkbyte10 *)&__return_storage_ptr__->data = in_ST0;
  return __return_storage_ptr__;
}

Assistant:

char peek(istream &in)
		{
			return in->peek();
		}